

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrtf.cpp
# Opt level: O2

vector<std::string> *
EnumerateHrtf_abi_cxx11_(vector<std::string> *__return_storage_ptr__,char *devname)

{
  size_type sVar1;
  __type _Var2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
  _Var7;
  allocator<(anonymous_namespace)::HrtfEntry,_8UL> *__alloc;
  long lVar8;
  HrtfEntry *pHVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  _Alloc_hider _Var11;
  long lVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fname;
  char *pcVar13;
  long lVar14;
  HrtfEntry *pHVar15;
  char cVar16;
  undefined8 uVar17;
  HrtfEntry *pHVar18;
  HrtfEntry *pHVar19;
  allocator local_109;
  string pname;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> pathopt
  ;
  string newname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::mutex::lock((mutex *)(anonymous_namespace)::EnumeratedHrtfLock);
  pHVar9 = (anonymous_namespace)::EnumeratedHrtfs;
  if (DAT_00229130 != (anonymous_namespace)::EnumeratedHrtfs) {
    std::
    _Destroy<(anonymous_namespace)::HrtfEntry*,al::allocator<(anonymous_namespace)::HrtfEntry,8ul>>
              ((anonymous_namespace)::EnumeratedHrtfs,DAT_00229130,__alloc);
    DAT_00229130 = pHVar9;
  }
  ConfigValueStr_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&pname,devname,(char *)0x0,"hrtf-paths");
  al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<true,_true>
            (&pathopt,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&pname);
  al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&pname);
  if (pathopt.mHasValue == true) {
    bVar3 = true;
    uVar17 = pathopt.field_1.mValue._M_dataplus._M_p;
LAB_0014c03e:
    do {
      _Var11._M_p = (pointer)uVar17;
      if ((_Var11._M_p == (char *)0x0) || (cVar16 = *_Var11._M_p, cVar16 == '\0'))
      goto LAB_0014c131;
      while ((iVar4 = isspace((int)cVar16), cVar16 == ',' || (iVar4 != 0))) {
        cVar16 = _Var11._M_p[1];
        _Var11._M_p = _Var11._M_p + 1;
      }
      uVar17 = _Var11._M_p;
      if (cVar16 != '\0') {
        pcVar5 = strchr(_Var11._M_p,0x2c);
        if (pcVar5 == (char *)0x0) {
          sVar6 = strlen(_Var11._M_p);
          uVar17 = (char *)0x0;
          bVar3 = false;
          pcVar5 = _Var11._M_p + sVar6;
        }
        else {
          uVar17 = pcVar5 + 1;
        }
        do {
          pcVar13 = pcVar5;
          if (pcVar13 == _Var11._M_p) goto LAB_0014c03e;
          iVar4 = isspace((int)pcVar13[-1]);
          pcVar5 = pcVar13 + -1;
        } while (iVar4 != 0);
        pname._M_dataplus._M_p = (pointer)&pname.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&pname,_Var11._M_p,pcVar13);
        SearchDataFiles_abi_cxx11_((vector<std::string> *)&newname,".mhr",pname._M_dataplus._M_p);
        sVar1 = newname._M_string_length;
        for (_Var11 = newname._M_dataplus; _Var11._M_p != (pointer)sVar1;
            _Var11._M_p = _Var11._M_p + 0x20) {
          anon_unknown.dwarf_1ac959::AddFileEntry((string *)_Var11._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                   *)&newname);
        std::__cxx11::string::~string((string *)&pname);
      }
    } while( true );
  }
  al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&pathopt);
LAB_0014c145:
  SearchDataFiles_abi_cxx11_((vector<std::string> *)&pathopt,".mhr","openal/hrtf");
  uVar17 = pathopt.field_1.mValue._M_dataplus._M_p;
  for (_Var11._M_p = (pointer)CONCAT71(pathopt._1_7_,pathopt.mHasValue);
      _Var11._M_p != (pointer)uVar17; _Var11._M_p = _Var11._M_p + 0x20) {
    anon_unknown.dwarf_1ac959::AddFileEntry((string *)_Var11._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
             *)&pathopt);
  std::__cxx11::string::string((string *)&local_70,"Built-In HRTF",&local_109);
  std::__cxx11::to_string(&local_50,1);
  std::operator+(&newname,'!',&local_50);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pathopt,
                 &newname,'_');
  std::operator+(&pname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &pathopt,&local_70);
  std::__cxx11::string::~string((string *)&pathopt);
  std::__cxx11::string::~string((string *)&newname);
  std::__cxx11::string::~string((string *)&local_50);
  pHVar15 = DAT_00229130;
  pHVar9 = (anonymous_namespace)::EnumeratedHrtfs;
  lVar14 = (long)DAT_00229130 - (long)(anonymous_namespace)::EnumeratedHrtfs;
  lVar12 = 0;
  for (lVar8 = lVar14 >> 8;
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)&(pHVar9->mFilename)._M_dataplus._M_p + lVar12), 0 < lVar8;
      lVar8 = lVar8 + -1) {
    _Var2 = std::operator==(pbVar10,&pname);
    if (_Var2) {
      pHVar19 = (HrtfEntry *)((long)&(pHVar9->mDispName)._M_dataplus._M_p + lVar12);
      goto LAB_0014c333;
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pHVar9[1].mFilename._M_dataplus._M_p + lVar12),&pname);
    if (_Var2) {
      pHVar19 = (HrtfEntry *)((long)&pHVar9[1].mDispName._M_dataplus._M_p + lVar12);
      goto LAB_0014c333;
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pHVar9[2].mFilename._M_dataplus._M_p + lVar12),&pname);
    if (_Var2) {
      pHVar19 = (HrtfEntry *)((long)&pHVar9[2].mDispName._M_dataplus._M_p + lVar12);
      goto LAB_0014c333;
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pHVar9[3].mFilename._M_dataplus._M_p + lVar12),&pname);
    if (_Var2) {
      pHVar19 = (HrtfEntry *)((long)&pHVar9[3].mDispName._M_dataplus._M_p + lVar12);
      goto LAB_0014c333;
    }
    lVar12 = lVar12 + 0x100;
  }
  lVar8 = lVar14 - lVar12 >> 6;
  pHVar18 = (HrtfEntry *)((long)&(pHVar9->mDispName)._M_dataplus._M_p + lVar12);
  if (lVar8 == 1) {
LAB_0014c31a:
    _Var2 = std::operator==(&pHVar18->mFilename,&pname);
    pHVar19 = pHVar18;
    if (!_Var2) {
      pHVar19 = pHVar15;
    }
  }
  else if (lVar8 == 3) {
    _Var2 = std::operator==(pbVar10,&pname);
    pHVar19 = pHVar18;
    if (!_Var2) {
      pHVar18 = (HrtfEntry *)((long)&pHVar9[1].mDispName._M_dataplus._M_p + lVar12);
      goto LAB_0014c304;
    }
  }
  else {
    pHVar19 = pHVar15;
    if (lVar8 == 2) {
LAB_0014c304:
      _Var2 = std::operator==(&pHVar18->mFilename,&pname);
      pHVar19 = pHVar18;
      if (!_Var2) {
        pHVar18 = pHVar18 + 1;
        goto LAB_0014c31a;
      }
    }
  }
LAB_0014c333:
  if (pHVar19 == DAT_00229130) {
    std::__cxx11::string::string((string *)&newname,(string *)&local_70);
    iVar4 = 2;
    while (bVar3 = anon_unknown.dwarf_1ac959::checkName(&newname), bVar3) {
      std::__cxx11::string::_M_assign((string *)&newname);
      std::__cxx11::string::append((char *)&newname);
      std::__cxx11::to_string((string *)&pathopt,iVar4);
      std::__cxx11::string::append((string *)&newname);
      std::__cxx11::string::~string((string *)&pathopt);
      iVar4 = iVar4 + 1;
    }
    std::__cxx11::string::string((string *)&pathopt,(string *)&newname);
    pHVar9 = (HrtfEntry *)&pname;
    std::__cxx11::string::string((string *)(pathopt.field_1.mDummy + 0x18),(string *)pHVar9);
    std::
    vector<(anonymous_namespace)::HrtfEntry,_al::allocator<(anonymous_namespace)::HrtfEntry,_8UL>_>
    ::emplace_back<(anonymous_namespace)::HrtfEntry>
              ((vector<(anonymous_namespace)::HrtfEntry,_al::allocator<(anonymous_namespace)::HrtfEntry,_8UL>_>
                *)&pathopt,pHVar9);
    anon_unknown.dwarf_1ac959::HrtfEntry::~HrtfEntry((HrtfEntry *)&pathopt);
    if (2 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (II) Adding built-in entry \"%s\"\n",
              DAT_00229130[-1].mFilename._M_dataplus._M_p);
    }
    std::__cxx11::string::~string((string *)&newname);
  }
  else if (2 < (int)gLogLevel) {
    fprintf((FILE *)gLogFile,"[ALSOFT] (II) Skipping duplicate file entry %s\n",
            pname._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&pname);
  std::__cxx11::string::~string((string *)&local_70);
LAB_0014c442:
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
  ::reserve(__return_storage_ptr__,
            (long)DAT_00229130 - (long)(anonymous_namespace)::EnumeratedHrtfs >> 6);
  pHVar9 = DAT_00229130;
  for (pHVar15 = (anonymous_namespace)::EnumeratedHrtfs; pHVar15 != pHVar9; pHVar15 = pHVar15 + 1) {
    std::vector<std::__cxx11::string,al::allocator<std::__cxx11::string,8ul>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,al::allocator<std::__cxx11::string,8ul>> *)
               __return_storage_ptr__,&pHVar15->mDispName);
  }
  ConfigValueStr_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&pname,devname,(char *)0x0,"default-hrtf");
  al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<true,_true>
            (&pathopt,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&pname);
  al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&pname);
  if (pathopt.mHasValue == true) {
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,al::allocator<std::__cxx11::string,8ul>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      ((__return_storage_ptr__->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (__return_storage_ptr__->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                       )._M_impl.super__Vector_impl_data._M_finish,&pathopt.field_1);
    if (_Var7._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      if (1 < (int)gLogLevel) {
        fprintf((FILE *)gLogFile,"[ALSOFT] (WW) Failed to find default HRTF \"%s\"\n",
                pathopt.field_1.mValue._M_dataplus._M_p);
      }
    }
    else {
      pbVar10 = (__return_storage_ptr__->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (_Var7._M_current != pbVar10) {
        std::_V2::
        __rotate<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,al::allocator<std::__cxx11::string,8ul>>>>
                  (pbVar10,_Var7._M_current,_Var7._M_current + 1);
      }
    }
  }
  al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&pathopt);
  pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::EnumeratedHrtfLock);
  return __return_storage_ptr__;
LAB_0014c131:
  al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&pathopt);
  if (!bVar3) goto LAB_0014c442;
  goto LAB_0014c145;
}

Assistant:

al::vector<std::string> EnumerateHrtf(const char *devname)
{
    std::lock_guard<std::mutex> _{EnumeratedHrtfLock};
    EnumeratedHrtfs.clear();

    bool usedefaults{true};
    if(auto pathopt = ConfigValueStr(devname, nullptr, "hrtf-paths"))
    {
        const char *pathlist{pathopt->c_str()};
        while(pathlist && *pathlist)
        {
            const char *next, *end;

            while(isspace(*pathlist) || *pathlist == ',')
                pathlist++;
            if(*pathlist == '\0')
                continue;

            next = strchr(pathlist, ',');
            if(next)
                end = next++;
            else
            {
                end = pathlist + strlen(pathlist);
                usedefaults = false;
            }

            while(end != pathlist && isspace(*(end-1)))
                --end;
            if(end != pathlist)
            {
                const std::string pname{pathlist, end};
                for(const auto &fname : SearchDataFiles(".mhr", pname.c_str()))
                    AddFileEntry(fname);
            }

            pathlist = next;
        }
    }

    if(usedefaults)
    {
        for(const auto &fname : SearchDataFiles(".mhr", "openal/hrtf"))
            AddFileEntry(fname);

        if(!GetResource(IDR_DEFAULT_HRTF_MHR).empty())
            AddBuiltInEntry("Built-In HRTF", IDR_DEFAULT_HRTF_MHR);
    }

    al::vector<std::string> list;
    list.reserve(EnumeratedHrtfs.size());
    for(auto &entry : EnumeratedHrtfs)
        list.emplace_back(entry.mDispName);

    if(auto defhrtfopt = ConfigValueStr(devname, nullptr, "default-hrtf"))
    {
        auto iter = std::find(list.begin(), list.end(), *defhrtfopt);
        if(iter == list.end())
            WARN("Failed to find default HRTF \"%s\"\n", defhrtfopt->c_str());
        else if(iter != list.begin())
            std::rotate(list.begin(), iter, iter+1);
    }

    return list;
}